

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_timer.hxx
# Opt level: O0

uint64_t __thiscall nuraft::timer_helper::get_sec(timer_helper *this)

{
  type this_00;
  ulong uVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  rep_conflict rVar2;
  duration<double,_std::ratio<1L,_1L>_> elapsed;
  time_point cur;
  lock_guard<std::mutex> l;
  mutex_type *in_stack_ffffffffffffffa8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  duration<double,_std::ratio<1L,_1L>_> local_20;
  undefined8 local_18;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_18 = std::chrono::_V2::system_clock::now();
  this_00 = std::chrono::operator-
                      (in_RDI,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_ffffffffffffffb0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)this_00.__r,&in_RDI->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_20);
  uVar1 = (long)rVar2 | (long)(rVar2 - 9.223372036854776e+18) & (long)rVar2 >> 0x3f;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x27e4ab);
  return uVar1;
}

Assistant:

uint64_t get_sec() {
        std::lock_guard<std::mutex> l(lock_);
        auto cur = std::chrono::system_clock::now();
        std::chrono::duration<double> elapsed = cur - t_created_;
        return (uint64_t)elapsed.count();
    }